

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::internal::KeyMapBase<unsigned_long>::AssertLoadFactor
          (KeyMapBase<unsigned_long> *this)

{
  uint uVar1;
  Nonnull<const_char_*> pcVar2;
  unsigned_long v2;
  ulong v1;
  
  v1 = (ulong)(this->super_UntypedMapBase).num_elements_;
  uVar1 = (this->super_UntypedMapBase).num_buckets_;
  v2 = (ulong)(uVar1 & 0xfffffffe) - (ulong)(uVar1 >> 2 & 0xfffffffc);
  if (v2 < v1) {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                       (v1,v2,"num_elements_ <= CalculateHiCutoff(num_buckets_)");
  }
  else {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    return;
  }
  AssertLoadFactor();
}

Assistant:

void AssertLoadFactor() const {
    ABSL_DCHECK_LE(num_elements_, CalculateHiCutoff(num_buckets_));
  }